

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_string_char(jit_State *J,RecordFFData *rd)

{
  TRef *pTVar1;
  IRRef1 IVar2;
  IRRef1 IVar3;
  TRef TVar4;
  TRef TVar5;
  ulong uVar6;
  uint uVar7;
  
  TVar4 = lj_ir_kint(J,0xff);
  uVar6 = 0;
  TVar5 = *J->base;
  while (uVar7 = (uint)uVar6, TVar5 != 0) {
    TVar5 = lj_opt_narrow_toint(J,TVar5);
    (J->fold).ins.field_0.ot = 0x693;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
    lj_opt_fold(J);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b040002;
    TVar5 = lj_opt_fold(J);
    pTVar1 = J->base;
    pTVar1[uVar6] = TVar5;
    uVar6 = (ulong)(uVar7 + 1);
    TVar5 = pTVar1[uVar6];
  }
  if (uVar7 < 2) {
    if (uVar7 != 0) {
      return;
    }
    TVar5 = lj_ir_kgc(J,(GCobj *)(J[-1].penalty + 0x3a),IRT_STR);
  }
  else {
    TVar5 = lj_ir_kptr_(J,IR_KPTR,J[-1].penalty + 0x38);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x53050000;
    TVar4 = lj_opt_fold(J);
    IVar2 = (IRRef1)TVar4;
    TVar5 = *J->base;
    IVar3 = IVar2;
    if (TVar5 != 0) {
      uVar6 = 1;
      do {
        (J->fold).ins.field_0.ot = 0x5405;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
        TVar4 = lj_opt_fold(J);
        IVar3 = (IRRef1)TVar4;
        TVar5 = J->base[uVar6];
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (TVar5 != 0);
    }
    (J->fold).ins.field_0.ot = 0x5504;
    (J->fold).ins.field_0.op1 = IVar3;
    (J->fold).ins.field_0.op2 = IVar2;
    TVar5 = lj_opt_fold(J);
  }
  *J->base = TVar5;
  return;
}

Assistant:

static void LJ_FASTCALL recff_string_char(jit_State *J, RecordFFData *rd)
{
  TRef k255 = lj_ir_kint(J, 255);
  BCReg i;
  for (i = 0; J->base[i] != 0; i++) {  /* Convert char values to strings. */
    TRef tr = lj_opt_narrow_toint(J, J->base[i]);
    emitir(IRTGI(IR_ULE), tr, k255);
    J->base[i] = emitir(IRT(IR_TOSTR, IRT_STR), tr, IRTOSTR_CHAR);
  }
  if (i > 1) {  /* Concatenate the strings, if there's more than one. */
    TRef hdr = recff_bufhdr(J), tr = hdr;
    for (i = 0; J->base[i] != 0; i++)
      tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr, J->base[i]);
    J->base[0] = emitir(IRT(IR_BUFSTR, IRT_STR), tr, hdr);
  } else if (i == 0) {
    J->base[0] = lj_ir_kstr(J, &J2G(J)->strempty);
  }
  UNUSED(rd);
}